

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_resize(wchar_t w,wchar_t h)

{
  term_win **s;
  int *piVar1;
  term_win *ptVar2;
  void *pvVar3;
  wchar_t local_78;
  wchar_t local_74;
  term_win *trash;
  ui_event evt;
  term_win *hold_tmp;
  term_win **hold_mem_dest;
  term_win *hold_mem;
  term_win *hold_scr;
  term_win *hold_old;
  int *hold_x2;
  int *hold_x1;
  wchar_t hgt;
  wchar_t wid;
  wchar_t i;
  wchar_t h_local;
  wchar_t w_local;
  
  evt.type = EVT_NONE;
  stack0xffffffffffffff9c = 4;
  if ((Term->fixed_shape & 1U) == 0) {
    if ((w < L'\x01') || (h < L'\x01')) {
      h_local = L'\xffffffff';
    }
    else if ((Term->wid == w) && (Term->hgt == h)) {
      h_local = L'\x01';
    }
    else {
      local_74 = w;
      if (Term->wid <= w) {
        local_74 = Term->wid;
      }
      hold_x1._4_4_ = local_74;
      local_78 = h;
      if (Term->hgt <= h) {
        local_78 = Term->hgt;
      }
      hold_x1._0_4_ = local_78;
      hold_x2 = Term->x1;
      hold_old = (term_win *)Term->x2;
      hold_scr = Term->old;
      hold_mem = Term->scr;
      hold_mem_dest = (term_win **)Term->mem;
      evt._4_8_ = Term->tmp;
      wid = h;
      i = w;
      piVar1 = (int *)mem_zalloc((long)h << 2);
      Term->x1 = piVar1;
      piVar1 = (int *)mem_zalloc((long)wid << 2);
      Term->x2 = piVar1;
      ptVar2 = (term_win *)mem_zalloc(0x60);
      Term->old = ptVar2;
      term_win_init(Term->old,i,wid);
      term_win_copy(Term->old,hold_scr,hold_x1._4_4_,(wchar_t)hold_x1);
      ptVar2 = (term_win *)mem_zalloc(0x60);
      Term->scr = ptVar2;
      term_win_init(Term->scr,i,wid);
      term_win_copy(Term->scr,hold_mem,hold_x1._4_4_,(wchar_t)hold_x1);
      hold_tmp = (term_win *)&Term->mem;
      while (hold_mem_dest != (term_win **)0x0) {
        pvVar3 = mem_zalloc(0x60);
        *(void **)hold_tmp = pvVar3;
        term_win_init(*(term_win **)hold_tmp,i,wid);
        term_win_copy(*(term_win **)hold_tmp,(term_win *)hold_mem_dest,hold_x1._4_4_,
                      (wchar_t)hold_x1);
        s = hold_mem_dest;
        hold_mem_dest = (term_win **)hold_mem_dest[0xb];
        if (i <= *(wchar_t *)(*(long *)hold_tmp + 4)) {
          **(undefined1 **)hold_tmp = 1;
        }
        if (wid <= *(wchar_t *)(*(long *)hold_tmp + 8)) {
          **(undefined1 **)hold_tmp = 1;
        }
        hold_tmp = (term_win *)(*(long *)hold_tmp + 0x58);
        term_win_nuke((term_win *)s);
        mem_free(s);
      }
      if (evt._4_8_ != 0) {
        ptVar2 = (term_win *)mem_zalloc(0x60);
        Term->tmp = ptVar2;
        term_win_init(Term->tmp,i,wid);
        term_win_copy(Term->tmp,(term_win *)evt._4_8_,hold_x1._4_4_,(wchar_t)hold_x1);
      }
      mem_free(hold_x2);
      mem_free(hold_old);
      term_win_nuke(hold_scr);
      mem_free(hold_scr);
      if (i <= Term->old->cx) {
        Term->old->cu = true;
      }
      if (wid <= Term->old->cy) {
        Term->old->cu = true;
      }
      term_win_nuke(hold_mem);
      mem_free(hold_mem);
      if (i <= Term->scr->cx) {
        Term->scr->cu = true;
      }
      if (wid <= Term->scr->cy) {
        Term->scr->cu = true;
      }
      if (evt._4_8_ != 0) {
        term_win_nuke((term_win *)evt._4_8_);
        mem_free((void *)evt._4_8_);
        if (i <= Term->tmp->cx) {
          Term->tmp->cu = true;
        }
        if (wid <= Term->tmp->cy) {
          Term->tmp->cu = true;
        }
      }
      Term->wid = i;
      Term->hgt = wid;
      Term->total_erase = true;
      for (hgt = L'\0'; hgt < wid; hgt = hgt + L'\x01') {
        Term->x1[hgt] = 0;
        Term->x2[hgt] = i + L'\xffffffff';
      }
      Term->y1 = 0;
      Term->y2 = wid + L'\xffffffff';
      Term_event_push((ui_event *)((long)&trash + 4));
      h_local = L'\0';
    }
  }
  else {
    h_local = L'\xffffffff';
  }
  return h_local;
}

Assistant:

errr Term_resize(int w, int h)
{
	int i;

	int wid, hgt;

	int *hold_x1;
	int *hold_x2;

	term_win *hold_old;
	term_win *hold_scr;
	term_win *hold_mem;
	term_win **hold_mem_dest;
	term_win *hold_tmp;

	ui_event evt = EVENT_EMPTY;
	evt.type = EVT_RESIZE;

	/* Resizing is forbidden */
	if (Term->fixed_shape) return (-1);

	/* Ignore illegal changes */
	if ((w < 1) || (h < 1)) return (-1);

	/* Ignore non-changes */
	if ((Term->wid == w) && (Term->hgt == h)) return (1);

	/* Minimum dimensions */
	wid = MIN(Term->wid, w);
	hgt = MIN(Term->hgt, h);

	/* Save scanners */
	hold_x1 = Term->x1;
	hold_x2 = Term->x2;

	/* Save old window */
	hold_old = Term->old;

	/* Save old window */
	hold_scr = Term->scr;

	/* Save old window */
	hold_mem = Term->mem;

	/* Save old window */
	hold_tmp = Term->tmp;

	/* Create new scanners */
	Term->x1 = mem_zalloc(h * sizeof(int));
	Term->x2 = mem_zalloc(h * sizeof(int));

	/* Create new window */
	Term->old = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->old, w, h);

	/* Save the contents */
	term_win_copy(Term->old, hold_old, wid, hgt);

	/* Create new window */
	Term->scr = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->scr, w, h);

	/* Save the contents */
	term_win_copy(Term->scr, hold_scr, wid, hgt);

	/* If needed */
	hold_mem_dest = &Term->mem;
	while (hold_mem != 0) {
		term_win* trash;

		/* Create new window */
		*hold_mem_dest = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(*hold_mem_dest, w, h);

		/* Save the contents */
		term_win_copy(*hold_mem_dest, hold_mem, wid, hgt);

		trash = hold_mem;
		hold_mem = hold_mem->next;

		if ((*hold_mem_dest)->cx >= w) (*hold_mem_dest)->cu = 1;
		if ((*hold_mem_dest)->cy >= h) (*hold_mem_dest)->cu = 1;

		hold_mem_dest = &((*hold_mem_dest)->next);

		term_win_nuke(trash);
		mem_free(trash);
	}

	/* If needed */
	if (hold_tmp) {
		/* Create new window */
		Term->tmp = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(Term->tmp, w, h);

		/* Save the contents */
		term_win_copy(Term->tmp, hold_tmp, wid, hgt);
	}

	/* Free some arrays */
	mem_free(hold_x1);
	mem_free(hold_x2);

	/* Nuke */
	term_win_nuke(hold_old);

	/* Kill */
	mem_free(hold_old);

	/* Illegal cursor */
	if (Term->old->cx >= w) Term->old->cu = 1;
	if (Term->old->cy >= h) Term->old->cu = 1;

	/* Nuke */
	term_win_nuke(hold_scr);

	/* Kill */
	mem_free(hold_scr);

	/* Illegal cursor */
	if (Term->scr->cx >= w) Term->scr->cu = 1;
	if (Term->scr->cy >= h) Term->scr->cu = 1;

	/* If needed */
	if (hold_tmp) {
		/* Nuke */
		term_win_nuke(hold_tmp);

		/* Kill */
		mem_free(hold_tmp);

		/* Illegal cursor */
		if (Term->tmp->cx >= w) Term->tmp->cu = 1;
		if (Term->tmp->cy >= h) Term->tmp->cu = 1;
	}

	/* Save new size */
	Term->wid = w;
	Term->hgt = h;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Assume change */
	for (i = 0; i < h; i++) {
		/* Assume change */
		Term->x1[i] = 0;
		Term->x2[i] = w - 1;
	}

	/* Assume change */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Push a resize event onto the stack */
	Term_event_push(&evt);

	/* Success */
	return (0);
}